

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRViewportNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRViewportNode::render
          (VRViewportNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  allocator<char> local_e1;
  string local_e0;
  VRRect local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  VRDataIndex::pushState(renderState);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"ViewportX",&local_e1);
  VRDataIndex::addData(&local_40,renderState,&local_e0,(int)(this->_rect).m_xOffset);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"ViewportY",&local_e1);
  VRDataIndex::addData(&local_60,renderState,&local_e0,(int)(this->_rect).m_yOffset);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"ViewportWidth",&local_e1);
  VRDataIndex::addData(&local_80,renderState,&local_e0,(int)(this->_rect).m_width);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"ViewportHeight",&local_e1)
  ;
  VRDataIndex::addData(&local_a0,renderState,&local_e0,(int)(this->_rect).m_height);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  local_c0.super_VRWritable._vptr_VRWritable = (_func_int **)&PTR__VRRect_0015dd08;
  local_c0.m_xOffset = (this->_rect).m_xOffset;
  local_c0.m_yOffset = (this->_rect).m_yOffset;
  local_c0.m_width = (this->_rect).m_width;
  local_c0.m_height = (this->_rect).m_height;
  local_c0.m_usePercent = (this->_rect).m_usePercent;
  (**(code **)(*(long *)this->_gfxToolkit + 0x20))();
  VRRect::~VRRect(&local_c0);
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void VRViewportNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {
  renderState->pushState();

	// Is this the kind of state information we expect to pass from one node to the next?
	renderState->addData("ViewportX", (int)_rect.getX());
	renderState->addData("ViewportY", (int)_rect.getY());
	renderState->addData("ViewportWidth", (int)_rect.getWidth());
	renderState->addData("ViewportHeight", (int)_rect.getHeight());
  
	_gfxToolkit->setSubWindow(_rect);

	VRDisplayNode::render(renderState, renderHandler);

    renderState->popState();
}